

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O1

void __thiscall
SquareRootUnscentedKalmanFilter_computeKalmanGain_Test::TestBody
          (SquareRootUnscentedKalmanFilter_computeKalmanGain_Test *this)

{
  CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *this_00;
  CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *pCVar1;
  CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *pCVar2;
  char *__function;
  undefined1 local_248 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  Vector<float,_2> mean;
  Scalar local_138 [2];
  Matrix<T,_2,_2> Ssquared;
  template_SigmaPoints<decltype(mean)> sigmaPoints;
  Matrix<T,_3,_2> P_xy_ref;
  Scalar local_d0;
  Scalar local_cc;
  Scalar local_c8;
  Scalar local_c4;
  Scalar local_c0 [2];
  Matrix<T,_3,_2> K_ref;
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S;
  Scalar local_7c;
  Scalar local_78 [2];
  Matrix<T,_3,_2> K;
  Scalar local_54;
  Scalar local_50 [2];
  AssertionResult gtest_ar;
  Scalar local_38 [2];
  
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_248,1.0,2.0,1.0);
  Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array._8_8_
       = (long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
                super_Matrix<float,_7,_1>.
                super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.m_data + 0x14;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[0]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[1]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[2]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[3]
       = 0.0;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[4]
       = 1.4013e-45;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array[5]
       = 0.0;
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.sigmaWeights_m.
  super_Matrix<float,_7,_1>.super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.m_storage.
  m_data.array[5] = 3.0;
  K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_> *)
                      (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                       m_storage.m_data.array + 2),
                      K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                      m_data.array + 4);
  local_78[0] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar1,local_78)
  ;
  sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
  [0xc] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>
                             .m_storage.m_data.array + 0xc);
  local_c0[0] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar1,local_c0)
  ;
  local_138[0] = 5.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_
                     (pCVar1,local_138);
  local_50[0] = 5.0;
  Eigen::CommaInitializer<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>::operator_(pCVar1,local_50);
  if ((sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array._16_8_ +
       sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
       array._0_8_ == 7) &&
     (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      ._8_8_ == 1)) {
    Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array.
    _8_8_ = &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
             super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
             super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized;
    this_00 = (CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> *)
              (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data
               .array + 2);
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [0] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [1] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [2] = 1.4013e-45;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [3] = 0.0;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [4] = 1.4013e-45;
    sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
    [5] = 0.0;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
    ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0x400000;
    K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array[4] =
         3.0;
    Eigen::CommaInitializer<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>::operator_
              (this_00,K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                       m_data.array + 4);
    if ((sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
         array._16_8_ +
         sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
         array._0_8_ == 2) &&
       (sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.
        array._8_8_ == 1)) {
      Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
           = 1.0;
      local_78[0] = 2.0;
      K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array.
      _16_8_ = this_00;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_> *)
                          (K_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                           m_storage.m_data.array + 4),local_78);
      sigmaPoints.super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.m_storage.m_data.array
      [0xc] = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,sigmaPoints.
                                 super_PlainObjectBase<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>.
                                 m_storage.m_data.array + 0xc);
      local_c0[0] = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,local_c0);
      local_138[0] = 0.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,local_138);
      local_50[0] = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,local_50);
      local_38[0] = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,local_38);
      gtest_ar.message_.ptr_._0_4_ = 0x40000000;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,(Scalar *)&gtest_ar.message_);
      local_54 = 3.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_54);
      local_7c = 3.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_7c);
      local_d0 = 2.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_d0);
      local_cc = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_cc);
      local_c8 = 1.0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_
                         (pCVar2,&local_c8);
      local_c4 = 2.0;
      Eigen::CommaInitializer<Eigen::Matrix<float,_2,_7,_0,_2,_7>_>::operator_(pCVar2,&local_c4);
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 7>>::finished() [MatrixType = Eigen::Matrix<float, 2, 7>]"
      ;
    }
    else {
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 2, 1>>::finished() [MatrixType = Eigen::Matrix<float, 2, 1>]"
      ;
    }
  }
  else {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<float, 7, 1>>::finished() [MatrixType = Eigen::Matrix<float, 7, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, computeKalmanGain) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    ukf.sigmaWeights_c << 3, 5, 5, 5, 5, 5, 5;
    
    Vector<T,2> mean;
    mean << 2, 3;
    
    typename SquareRootUnscentedKalmanFilter<Vector<T, 3>>::template SigmaPoints<decltype(mean)> sigmaPoints;
    sigmaPoints <<
        1,  2,  1,  1,  0,  1,  1,
        2,  3,  3,  2,  1,  1,  2;
    
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        35, 34,
        34, 46;
        
    Cholesky<Matrix<T,2,2>> S;
    S.compute(Ssquared);
    ASSERT_TRUE(S.info() == Eigen::Success);
    
    // x and sigmaStatePoints
    ukf.x << 3, 5, 7;
    ukf.sigmaStatePoints <<
        3,  5, 3, 3, 1, 3, 3,
        5,  7, 7, 5, 3, 3, 5,
        7, 11, 9, 9, 3, 5, 5;
    
    // Reference value for P
    Matrix<T,3,2> P_xy_ref;
    P_xy_ref <<
        20, 20,
        20, 40,
        40, 60;
    
    // Reference value for K
    Matrix<T, 3, 2> K_ref;
    K_ref <<
        0.528634361233480, 0.044052863436123,
       -0.969162995594713, 1.585903083700440,
       -0.440528634361233, 1.629955947136563;
    
    // Kalman gain to be computed
    Matrix<T, 3, 2> K;
    ukf.computeKalmanGain(mean, sigmaPoints, S, K);
    
    ASSERT_MATRIX_NEAR(K_ref, K, 1e-6);
}